

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcLShapeProfileDef::~IfcLShapeProfileDef(IfcLShapeProfileDef *this)

{
  undefined1 *puVar1;
  
  this[-1].Thickness = 4.30684928530148e-317;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x80 = 0x850390;
  puVar1 = *(undefined1 **)&this[-1].LegSlope.have;
  if ((bool *)puVar1 != &this[-1].CentreOfGravityInX.have) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&this[-1].FilletRadius.have;
  if ((bool *)puVar1 != &this[-1].EdgeRadius.have) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].Thickness);
  return;
}

Assistant:

IfcLShapeProfileDef() : Object("IfcLShapeProfileDef") {}